

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_107107::GetLoadStoreInfo(VmModule *module,VmInstruction *inst)

{
  uint uVar1;
  VmValue **ppVVar2;
  uint accessSize;
  VmValue *pVVar3;
  VmConstant *loadOffset;
  
  uVar1 = (inst->arguments).count;
  if ((uVar1 != 0) && (uVar1 != 1)) {
    ppVVar2 = (inst->arguments).data;
    pVVar3 = *ppVVar2;
    loadOffset = (VmConstant *)ppVVar2[1];
    if ((loadOffset == (VmConstant *)0x0) || ((loadOffset->super_VmValue).typeID != 1)) {
      loadOffset = (VmConstant *)0x0;
    }
    uVar1 = (inst->super_VmValue).type.size;
    accessSize = GetAccessSize(inst);
    pVVar3 = GetLoadStoreInfo(module,pVVar3,loadOffset,uVar1,accessSize,inst->cmd);
    return pVVar3;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,"T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
               );
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}